

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O3

void __thiscall Node::ScanMap(Node *this)

{
  pointer pcVar1;
  Node *this_00;
  uint __val;
  uint uVar2;
  int iVar3;
  long *plVar4;
  uint uVar5;
  long *plVar6;
  uint uVar7;
  ulong uVar8;
  uint __len;
  string __str;
  string tempname;
  VariableStruct ThisVar;
  long *local_148;
  long local_138;
  long lStack_130;
  long *local_128 [2];
  long local_118 [2];
  string local_108;
  string local_e8;
  undefined1 local_c8 [40];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  pointer local_48;
  pointer local_38;
  
  pcVar1 = (this->Tree[0]->TextValue)._M_dataplus._M_p;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + (this->Tree[0]->TextValue)._M_string_length);
  VariableStruct::VariableStruct
            ((VariableStruct *)local_c8,&local_e8,VARTYPE_STRUCT,VARCLASS_NONE,1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  genname(&local_108,(string *)local_c8);
  iVar3 = VariableList::LookupReserved(Variables,&local_108);
  if (iVar3 != 0) {
    uVar7 = Variables->vcount;
    Variables->vcount = uVar7 + 1;
    __val = -uVar7;
    if (0 < (int)uVar7) {
      __val = uVar7;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar5 = (uint)uVar8;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_0010a669;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_0010a669;
        }
        if (uVar5 < 10000) goto LAB_0010a669;
        uVar8 = uVar8 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_0010a669:
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct((ulong)local_128,(char)__len - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_128[0]),__len,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,0x12c841);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_138 = *plVar6;
      lStack_130 = plVar4[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar6;
      local_148 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_148);
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if (local_128[0] != local_118) {
      operator_delete(local_128[0],local_118[0] + 1);
    }
  }
  std::__cxx11::string::_M_assign((string *)&local_a0);
  VariableList::Append(Variables,(VariableStruct *)local_c8,0);
  VariableList::Fixup(Variables);
  this_00 = this->Tree[1];
  if (this_00 != (Node *)0x0) {
    uVar7 = 0;
    if (this_00->Type == 0x1d8) {
      uVar7 = (uint)(this_00->Block[0] == (Node *)0x0);
    }
    ScanOneMap(this_00,(VariableStruct *)local_c8,uVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != local_70) {
    operator_delete(local_80._M_p,local_70[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  return;
}

Assistant:

void Node::ScanMap(void)
{
	VariableStruct ThisVar(Tree[0]->TextValue,
		VARTYPE_STRUCT, VARCLASS_NONE, true);

	//
	// We need to name the map so we can use the nasme as a prefix.
	// This will likely cause problems with ocerlapping MAP/COMMON
	// statements, but it's better than nothing.
	//
	std::string tempname = genname(ThisVar.BasicName);
	if (Variables->LookupReserved(tempname) == false)
	{
		//tempName = tempname;
	}
	else
	{
		tempname += "_V" + std::to_string(Variables->vcount++);
	}
	ThisVar.CName = tempname;

	Variables->Append(ThisVar);
	Variables->Fixup();
 
	if (Tree[1] != 0)
	{
		Tree[1]->ScanOneMap(&ThisVar,
			Tree[1]->Type == BAS_V_DEFINEVAR &&
			Tree[1]->Block[0] == 0);
	}
}